

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<tinyusdz::value::matrix4d>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *dest)

{
  uint uVar1;
  pointer piVar2;
  size_type sVar3;
  value_type_conflict vVar4;
  long *plVar5;
  pointer piVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong *puVar10;
  ulong uVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  ulong uVar15;
  byte bVar16;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  _Alloc_hider local_98;
  undefined8 local_90;
  ulong local_88;
  long lStack_80;
  ulong *local_78;
  undefined8 local_70;
  ulong local_68;
  long lStack_60;
  long local_58;
  string local_50;
  
  bVar16 = 0;
  if (dest == (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)0x0)
  {
    local_98._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_98);
  }
  else {
    piVar6 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar6 == piVar2) {
      std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::operator=
                (dest,values);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = true;
    }
    else if ((elementSize == 0) ||
            (uVar15 = (ulong)elementSize,
            (ulong)((long)(values->
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(values->
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 7) % uVar15 != 0)) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = false;
    }
    else {
      std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::resize
                (dest,((long)piVar2 - (long)piVar6 >> 2) * uVar15);
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_98._M_p = (pointer)0x0;
      piVar6 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish == piVar6) {
        vVar4 = true;
      }
      else {
        local_58 = uVar15 << 7;
        vVar4 = true;
        do {
          uVar1 = piVar6[(long)local_98._M_p];
          if (((int)uVar1 < 0) ||
             (uVar7 = ((ulong)uVar1 + 1) * uVar15,
             uVar11 = (long)(values->
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(values->
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 7,
             uVar11 <= uVar7 && uVar7 - uVar11 != 0)) {
            if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                         (iterator)
                         local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_98);
            }
            else {
              *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish = (unsigned_long)local_98._M_p;
              local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            vVar4 = false;
          }
          else {
            lVar14 = (ulong)uVar1 * local_58;
            lVar9 = (long)local_98._M_p * local_58;
            uVar7 = uVar15;
            do {
              puVar12 = (undefined8 *)
                        ((long)((values->
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m[0] + lVar14);
              puVar13 = (undefined8 *)
                        ((long)((dest->
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                )._M_impl.super__Vector_impl_data._M_start)->m[0] + lVar9);
              for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
                *puVar13 = *puVar12;
                puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
                puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
              }
              lVar14 = lVar14 + 0x80;
              lVar9 = lVar9 + 0x80;
              uVar7 = uVar7 - 1;
            } while (uVar7 != 0);
          }
          local_98._M_p = local_98._M_p + 1;
          piVar6 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        } while (local_98._M_p <
                 (ulong *)((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar6 >> 2));
      }
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value = vVar4;
      }
      else {
        tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&local_b8,5);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x25b3f1);
        puVar10 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar10) {
          local_68 = *puVar10;
          lStack_60 = plVar5[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *puVar10;
          local_78 = (ulong *)*plVar5;
        }
        local_88 = local_68;
        sVar3 = plVar5[1];
        *plVar5 = (long)puVar10;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if (local_78 == &local_68) {
          lStack_80 = lStack_60;
          local_98._M_p = (pointer)&local_88;
        }
        else {
          local_98._M_p = (pointer)local_78;
        }
        local_68 = local_68 & 0xffffffffffffff00;
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = false;
        puVar10 = (ulong *)((long)&(__return_storage_ptr__->contained).
                                   super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   .field_0 + 0x10);
        *(ulong **)
         &(__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0 = puVar10;
        if ((ulong *)local_98._M_p == &local_88) {
          *puVar10 = local_88;
          *(long *)((long)&(__return_storage_ptr__->contained).
                           super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .field_0 + 0x18) = lStack_80;
        }
        else {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_error._M_dataplus._M_p = local_98._M_p;
          *(ulong *)((long)&(__return_storage_ptr__->contained).
                            super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            .field_0 + 0x10) = local_88;
        }
        (__return_storage_ptr__->contained).
        super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_error._M_string_length = sVar3;
        local_88 = local_88 & 0xffffffffffffff00;
        local_70 = 0;
        local_90 = 0;
        local_98._M_p = (pointer)&local_88;
        local_78 = &local_68;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}